

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_avx2.c
# Opt level: O3

void av1_fwd_txfm2d_64x64_avx2(int16_t *input,int32_t *output,int stride,TX_TYPE tx_type,int bd)

{
  undefined1 auVar1 [32];
  byte bVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  bool bVar6;
  int8_t *piVar7;
  uint uVar8;
  int16_t *piVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  __m256i *palVar13;
  __m256i *palVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  longlong *plVar18;
  longlong *plVar19;
  bool bVar20;
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  __m256i buf0 [512];
  __m256i buf1 [512];
  undefined8 auStack_8860 [2];
  undefined8 auStack_8850 [254];
  longlong local_8060 [4];
  longlong local_8040 [4];
  longlong local_8020 [2040];
  longlong local_4060 [8];
  longlong local_4020 [2046];
  
  piVar7 = av1_fwd_txfm_shift_ls[4];
  uVar16 = (ulong)(uint)bd;
  plVar18 = local_8060;
  plVar19 = local_8040;
  lVar10 = 0;
  do {
    lVar11 = 0;
    piVar9 = input;
    do {
      uVar3 = *(undefined8 *)(piVar9 + 4);
      uVar4 = *(undefined8 *)(piVar9 + 8);
      uVar5 = *(undefined8 *)(piVar9 + 0xc);
      *(undefined8 *)((long)auStack_8860 + lVar11) = *(undefined8 *)piVar9;
      *(undefined8 *)((long)auStack_8860 + lVar11 + 8) = uVar3;
      *(undefined8 *)((long)auStack_8850 + lVar11) = uVar4;
      *(undefined8 *)((long)auStack_8850 + lVar11 + 8) = uVar5;
      lVar11 = lVar11 + 0x20;
      piVar9 = piVar9 + stride;
    } while (lVar11 != 0x800);
    lVar11 = 0;
    do {
      auVar21 = vpmovsxwd_avx2(*(undefined1 (*) [16])((long)auStack_8860 + lVar11));
      auVar22 = vpmovsxwd_avx2(*(undefined1 (*) [16])((long)auStack_8850 + lVar11));
      *(undefined1 (*) [32])(plVar19 + lVar11 + -4) = auVar21;
      *(undefined1 (*) [32])(plVar19 + lVar11) = auVar22;
      lVar11 = lVar11 + 0x20;
    } while (lVar11 != 0x800);
    bVar2 = *piVar7;
    uVar8 = (uint)(char)bVar2;
    if ((int)uVar8 < 0) {
      uVar15 = 1 << (~bVar2 & 0x1f);
      uVar16 = (ulong)uVar15;
      auVar21._4_4_ = uVar15;
      auVar21._0_4_ = uVar15;
      auVar21._8_4_ = uVar15;
      auVar21._12_4_ = uVar15;
      auVar21._16_4_ = uVar15;
      auVar21._20_4_ = uVar15;
      auVar21._24_4_ = uVar15;
      auVar21._28_4_ = uVar15;
      lVar11 = 0;
      do {
        auVar22 = vpaddd_avx2(auVar21,*(undefined1 (*) [32])((long)plVar18 + lVar11));
        auVar22 = vpsrad_avx2(auVar22,ZEXT416(-uVar8));
        *(undefined1 (*) [32])((long)plVar18 + lVar11) = auVar22;
        lVar11 = lVar11 + 0x100;
      } while (lVar11 != 0x4000);
LAB_0047cd08:
      palVar13 = (__m256i *)(local_8040 + lVar10 * 8);
      if ((char)bVar2 < '\0') {
        iVar12 = 1 << (~bVar2 & 0x1f);
        auVar22._4_4_ = iVar12;
        auVar22._0_4_ = iVar12;
        auVar22._8_4_ = iVar12;
        auVar22._12_4_ = iVar12;
        auVar22._16_4_ = iVar12;
        auVar22._20_4_ = iVar12;
        auVar22._24_4_ = iVar12;
        auVar22._28_4_ = iVar12;
        lVar11 = 0;
        do {
          auVar21 = vpaddd_avx2(auVar22,*(undefined1 (*) [32])((long)plVar19 + lVar11));
          auVar21 = vpsrad_avx2(auVar21,ZEXT416(-uVar8));
          *(undefined1 (*) [32])((long)plVar19 + lVar11) = auVar21;
          lVar11 = lVar11 + 0x100;
        } while (lVar11 != 0x4000);
      }
      else if (bVar2 != 0) {
        lVar11 = 0;
        do {
          auVar21 = vpslld_avx2(*(undefined1 (*) [32])((long)plVar19 + lVar11),ZEXT416(uVar8));
          *(undefined1 (*) [32])((long)plVar19 + lVar11) = auVar21;
          lVar11 = lVar11 + 0x100;
        } while (lVar11 != 0x4000);
      }
    }
    else {
      if (bVar2 != 0) {
        lVar11 = 0;
        do {
          auVar21 = vpslld_avx2(*(undefined1 (*) [32])((long)plVar18 + lVar11),ZEXT416(uVar8));
          *(undefined1 (*) [32])((long)plVar18 + lVar11) = auVar21;
          lVar11 = lVar11 + 0x100;
        } while (lVar11 != 0x4000);
        goto LAB_0047cd08;
      }
      palVar13 = (__m256i *)(local_8040 + lVar10 * 8);
    }
    fdct64_avx2((__m256i *)(local_8060 + lVar10 * 8),(__m256i *)(local_8060 + lVar10 * 8),'\r',8,
                (int)uVar16);
    fdct64_avx2(palVar13,palVar13,'\r',8,(int)uVar16);
    bVar2 = piVar7[1];
    uVar8 = (uint)(char)bVar2;
    if ((int)uVar8 < 0) {
      iVar12 = 1 << (~bVar2 & 0x1f);
      auVar23._4_4_ = iVar12;
      auVar23._0_4_ = iVar12;
      auVar23._8_4_ = iVar12;
      auVar23._12_4_ = iVar12;
      auVar23._16_4_ = iVar12;
      auVar23._20_4_ = iVar12;
      auVar23._24_4_ = iVar12;
      auVar23._28_4_ = iVar12;
      lVar11 = 0;
      do {
        auVar21 = vpaddd_avx2(auVar23,*(undefined1 (*) [32])((long)plVar18 + lVar11));
        auVar21 = vpsrad_avx2(auVar21,ZEXT416(-uVar8));
        *(undefined1 (*) [32])((long)plVar18 + lVar11) = auVar21;
        lVar11 = lVar11 + 0x100;
      } while (lVar11 != 0x4000);
LAB_0047ce3f:
      if ((char)bVar2 < '\0') {
        iVar12 = 1 << (~bVar2 & 0x1f);
        auVar24._4_4_ = iVar12;
        auVar24._0_4_ = iVar12;
        auVar24._8_4_ = iVar12;
        auVar24._12_4_ = iVar12;
        auVar24._16_4_ = iVar12;
        auVar24._20_4_ = iVar12;
        auVar24._24_4_ = iVar12;
        auVar24._28_4_ = iVar12;
        lVar11 = 0;
        do {
          auVar21 = vpaddd_avx2(auVar24,*(undefined1 (*) [32])((long)*palVar13 + lVar11));
          auVar21 = vpsrad_avx2(auVar21,ZEXT416(-uVar8));
          *(undefined1 (*) [32])((long)*palVar13 + lVar11) = auVar21;
          lVar11 = lVar11 + 0x100;
        } while (lVar11 != 0x4000);
      }
      else if (bVar2 != 0) {
        lVar11 = 0;
        do {
          auVar21 = vpslld_avx2(*(undefined1 (*) [32])((long)*palVar13 + lVar11),ZEXT416(uVar8));
          *(undefined1 (*) [32])((long)*palVar13 + lVar11) = auVar21;
          lVar11 = lVar11 + 0x100;
        } while (lVar11 != 0x4000);
      }
    }
    else if (bVar2 != 0) {
      lVar11 = 0;
      do {
        auVar21 = vpslld_avx2(*(undefined1 (*) [32])((long)plVar18 + lVar11),ZEXT416(uVar8));
        *(undefined1 (*) [32])((long)plVar18 + lVar11) = auVar21;
        lVar11 = lVar11 + 0x100;
      } while (lVar11 != 0x4000);
      goto LAB_0047ce3f;
    }
    lVar10 = lVar10 + 1;
    input = input + 0x10;
    plVar19 = plVar19 + 8;
    plVar18 = plVar18 + 8;
  } while (lVar10 != 4);
  palVar13 = (__m256i *)local_4060;
  plVar18 = local_8060;
  uVar17 = 0;
  do {
    lVar10 = 0;
    palVar14 = palVar13;
    do {
      fwd_txfm_transpose_8x8_avx2((__m256i *)((long)plVar18 + lVar10),palVar14,8,8);
      palVar14 = palVar14 + 0x40;
      lVar10 = lVar10 + 0x20;
    } while (lVar10 != 0x100);
    palVar13 = palVar13 + 1;
    plVar18 = plVar18 + 0x100;
    bVar20 = uVar17 < 0x38;
    uVar17 = uVar17 + 8;
  } while (bVar20);
  bVar2 = piVar7[2];
  uVar8 = (uint)(char)bVar2;
  iVar12 = 1 << (~bVar2 & 0x1f);
  lVar10 = 1;
  palVar13 = &local_8060;
  palVar14 = (__m256i *)local_4060;
  bVar20 = true;
  do {
    fdct64_avx2(palVar14,palVar13,'\n',4,(int)uVar16);
    palVar14 = (__m256i *)(local_8060 + lVar10 * 4);
    fdct64_avx2((__m256i *)(local_4060 + lVar10 * 4),palVar14,'\n',4,(int)uVar16);
    if ((char)bVar2 < '\0') {
      lVar10 = 0;
      auVar1._4_4_ = iVar12;
      auVar1._0_4_ = iVar12;
      auVar1._8_4_ = iVar12;
      auVar1._12_4_ = iVar12;
      auVar1._16_4_ = iVar12;
      auVar1._20_4_ = iVar12;
      auVar1._24_4_ = iVar12;
      auVar1._28_4_ = iVar12;
      do {
        auVar21 = vpaddd_avx2(auVar1,*(undefined1 (*) [32])((long)*palVar13 + lVar10));
        auVar21 = vpsrad_avx2(auVar21,ZEXT416(-uVar8));
        *(undefined1 (*) [32])((long)*palVar13 + lVar10) = auVar21;
        lVar10 = lVar10 + 0x80;
      } while (lVar10 != 0x1000);
LAB_0047d026:
      if ((char)bVar2 < '\0') {
        lVar10 = 0;
        do {
          auVar21 = vpaddd_avx2(auVar1,*(undefined1 (*) [32])((long)*palVar14 + lVar10));
          auVar21 = vpsrad_avx2(auVar21,ZEXT416(-uVar8));
          *(undefined1 (*) [32])((long)*palVar14 + lVar10) = auVar21;
          lVar10 = lVar10 + 0x80;
        } while (lVar10 != 0x1000);
      }
      else if (bVar2 != 0) {
        lVar10 = 0;
        do {
          auVar21 = vpslld_avx2(*(undefined1 (*) [32])((long)*palVar14 + lVar10),ZEXT416(uVar8));
          *(undefined1 (*) [32])((long)*palVar14 + lVar10) = auVar21;
          lVar10 = lVar10 + 0x80;
        } while (lVar10 != 0x1000);
      }
    }
    else {
      auVar1._4_4_ = iVar12;
      auVar1._0_4_ = iVar12;
      auVar1._8_4_ = iVar12;
      auVar1._12_4_ = iVar12;
      auVar1._16_4_ = iVar12;
      auVar1._20_4_ = iVar12;
      auVar1._24_4_ = iVar12;
      auVar1._28_4_ = iVar12;
      if (bVar2 != 0) {
        lVar10 = 0;
        do {
          auVar21 = vpslld_avx2(*(undefined1 (*) [32])((long)*palVar13 + lVar10),ZEXT416(uVar8));
          *(undefined1 (*) [32])((long)*palVar13 + lVar10) = auVar21;
          lVar10 = lVar10 + 0x80;
        } while (lVar10 != 0x1000);
        goto LAB_0047d026;
      }
    }
    lVar10 = 3;
    palVar14 = (__m256i *)local_4020;
    palVar13 = (__m256i *)local_8020;
    bVar6 = !bVar20;
    bVar20 = false;
    if (bVar6) {
      memcpy(output,local_8060,0x1000);
      return;
    }
  } while( true );
}

Assistant:

void av1_fwd_txfm2d_64x64_avx2(const int16_t *input, int32_t *output,
                               int stride, TX_TYPE tx_type, int bd) {
  (void)bd;
  (void)tx_type;
  assert(tx_type == DCT_DCT);
  const TX_SIZE tx_size = TX_64X64;
  __m256i buf0[512], buf1[512];
  const int8_t *shift = av1_fwd_txfm_shift_ls[tx_size];
  const int txw_idx = get_txw_idx(tx_size);
  const int txh_idx = get_txh_idx(tx_size);
  const int cos_bit_col = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  const int cos_bit_row = av1_fwd_cos_bit_row[txw_idx][txh_idx];
  const int width = tx_size_wide[tx_size];
  const int height = tx_size_high[tx_size];
  const transform_1d_avx2 col_txfm = fdct64_avx2;
  const transform_1d_avx2 row_txfm = fdct64_avx2;
  const int width_div16 = (width >> 4);
  const int width_div8 = (width >> 3);
  int r, c;
  for (int i = 0; i < width_div16; i++) {
    load_buffer_16xn_avx2(input + (i << 4), &buf0[i << 1], stride, height,
                          width_div8, 0, 0);
    round_shift_32_8xn_avx2(&buf0[i << 1], height, shift[0], width_div8);
    round_shift_32_8xn_avx2(&buf0[(i << 1) + 1], height, shift[0], width_div8);
    col_txfm(&buf0[i << 1], &buf0[i << 1], cos_bit_col, width_div8, width_div8);
    col_txfm(&buf0[(i << 1) + 1], &buf0[(i << 1) + 1], cos_bit_col, width_div8,
             width_div8);
    round_shift_32_8xn_avx2(&buf0[i << 1], height, shift[1], width_div8);
    round_shift_32_8xn_avx2(&buf0[(i << 1) + 1], height, shift[1], width_div8);
  }

  for (r = 0; r < height; r += 8) {
    for (c = 0; c < width_div8; c++) {
      fwd_txfm_transpose_8x8_avx2(&buf0[r * width_div8 + c],
                                  &buf1[c * 8 * width_div8 + (r >> 3)],
                                  width_div8, width_div8);
    }
  }

  for (int i = 0; i < 2; i++) {
    row_txfm(&buf1[i << 1], &buf0[i << 1], cos_bit_row, width_div8,
             width_div16);
    row_txfm(&buf1[(i << 1) + 1], &buf0[(i << 1) + 1], cos_bit_row, width_div8,
             width_div16);
    round_shift_32_8xn_avx2(&buf0[i << 1], (height >> 1), shift[2],
                            width_div16);
    round_shift_32_8xn_avx2(&buf0[(i << 1) + 1], (height >> 1), shift[2],
                            width_div16);
  }

  store_buffer_avx2(buf0, output, 8, 128);
}